

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * cmCTest::SafeBuildIdField(string *__return_storage_ptr__,string *value)

{
  bool bVar1;
  long lVar2;
  char replace [2];
  char local_2a [2];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  bVar1 = std::operator!=(__return_storage_ptr__,"");
  if (bVar1) {
    lVar2 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x5b2a33);
    if (lVar2 != -1) {
      local_2a[1] = 0;
      for (lVar2 = 0; lVar2 != 0xd; lVar2 = lVar2 + 1) {
        local_2a[0] = "\\:*?\"<>|\n\r\t\f\v"[lVar2];
        cmsys::SystemTools::ReplaceString(__return_storage_ptr__,local_2a,"");
      }
    }
  }
  bVar1 = std::operator==(__return_storage_ptr__,"");
  if (bVar1) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::SafeBuildIdField(const std::string& value)
{
  std::string safevalue(value);

  if (safevalue != "") {
    // Disallow non-filename and non-space whitespace characters.
    // If they occur, replace them with ""
    //
    const char* disallowed = "\\:*?\"<>|\n\r\t\f\v";

    if (safevalue.find_first_of(disallowed) != std::string::npos) {
      std::string::size_type i = 0;
      std::string::size_type n = strlen(disallowed);
      char replace[2];
      replace[1] = 0;

      for (i = 0; i < n; ++i) {
        replace[0] = disallowed[i];
        cmSystemTools::ReplaceString(safevalue, replace, "");
      }
    }
  }

  if (safevalue == "") {
    safevalue = "(empty)";
  }

  return safevalue;
}